

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_NE_COLLECTIONS_Test::
iu_SyntaxTest_x_iutest_x_NE_COLLECTIONS_Test(iu_SyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this)

{
  iu_SyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_NE_COLLECTIONS_Test_006271f0;
  return;
}

Assistant:

IUTEST(SyntaxTest, NE_COLLECTIONS)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 5, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
}